

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void readDependenciesFromFiles
               (Options *options,QList<QtDependency> *files,QSet<QString> *usedDependencies,
               QSet<QString> *remainingDependencies)

{
  bool bVar1;
  const_iterator o;
  QtDependency *s;
  ulong uVar2;
  char *pcVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QLatin1String QVar5;
  QtDependency *fileName;
  QList<QtDependency> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  FILE *in_stack_ffffffffffffff48;
  FILE *in_stack_ffffffffffffff50;
  QString *key;
  QHash<QString,_QList<QtDependency>_> *this;
  QString *this_00;
  QSet<QString> *in_stack_ffffffffffffffa0;
  QSet<QString> *in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffb0;
  Options *in_stack_ffffffffffffffb8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QtDependency *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QtDependency>::begin((QList<QtDependency> *)in_stack_ffffffffffffff50);
  o = QList<QtDependency>::end((QList<QtDependency> *)in_stack_ffffffffffffff50);
  do {
    bVar1 = QList<QtDependency>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    s = QList<QtDependency>::const_iterator::operator*(&local_10);
    bVar1 = QSet<QString>::contains
                      ((QSet<QString> *)in_stack_ffffffffffffff50,
                       (QString *)in_stack_ffffffffffffff48);
    if (!bVar1) {
      key = &s->absolutePath;
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)key,(size_t)in_stack_ffffffffffffff50);
      QVar5.m_data = (char *)QVar4.m_size;
      QVar5.m_size = (qsizetype)key;
      uVar2 = QString::endsWith(QVar5,(CaseSensitivity)QVar4.m_data);
      if ((uVar2 & 1) != 0) {
        bVar1 = readDependenciesFromElf
                          (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        this_00 = (QString *)QVar4.m_data;
        if (!bVar1) {
          in_stack_ffffffffffffff50 = _stdout;
          QtPrivate::asString(&s->relativePath);
          QString::toLocal8Bit(this_00);
          pcVar3 = QByteArray::constData((QByteArray *)0x11e44a);
          fprintf(in_stack_ffffffffffffff50,"Skipping file dependency: %s\n",pcVar3);
          QByteArray::~QByteArray((QByteArray *)0x11e46d);
          goto LAB_0011e50f;
        }
      }
      QSet<QString>::insert((QSet<QString> *)QVar4.m_data,(QString *)QVar4.m_size);
      this = (QHash<QString,_QList<QtDependency>_> *)QVar4.m_size;
      if ((*(byte *)(in_RDI + 1) & 1) != 0) {
        in_stack_ffffffffffffff48 = _stdout;
        QtPrivate::asString(&s->relativePath);
        this = (QHash<QString,_QList<QtDependency>_> *)QVar4.m_size;
        QString::toLocal8Bit((QString *)QVar4.m_data);
        pcVar3 = QByteArray::constData((QByteArray *)0x11e4c6);
        fprintf(in_stack_ffffffffffffff48,"Appending file dependency: %s\n",pcVar3);
        QByteArray::~QByteArray((QByteArray *)0x11e4e5);
      }
      QHash<QString,_QList<QtDependency>_>::operator[](this,key);
      QList<QtDependency>::append
                ((QList<QtDependency> *)in_stack_ffffffffffffff50,
                 (parameter_type)in_stack_ffffffffffffff48);
    }
LAB_0011e50f:
    QList<QtDependency>::const_iterator::operator++(&local_10);
  } while( true );
}

Assistant:

void readDependenciesFromFiles(Options *options, const QList<QtDependency> &files,
                               QSet<QString> &usedDependencies,
                               QSet<QString> &remainingDependencies)
{
    for (const QtDependency &fileName : files) {
        if (usedDependencies.contains(fileName.absolutePath))
            continue;

        if (fileName.absolutePath.endsWith(".so"_L1)) {
            if (!readDependenciesFromElf(options, fileName.absolutePath, &usedDependencies,
                                         &remainingDependencies)) {
                fprintf(stdout, "Skipping file dependency: %s\n",
                        qPrintable(fileName.relativePath));
                continue;
            }
        }
        usedDependencies.insert(fileName.absolutePath);

        if (options->verbose) {
            fprintf(stdout, "Appending file dependency: %s\n", qPrintable(fileName.relativePath));
        }

        options->qtDependencies[options->currentArchitecture].append(fileName);
    }
}